

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference_values.cxx
# Opt level: O3

gga_reference *
gen_gga_reference_values
          (gga_reference *__return_storage_ptr__,Backend backend,Kernel kern,Spin polar)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  long *plVar4;
  byte bVar5;
  char cVar6;
  size_type __new_size;
  XCKernel func;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_48;
  
  (__return_storage_ptr__->vsigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vsigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vsigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  load_reference_density(&local_48,polar);
  __return_storage_ptr__->npts = local_48.first;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  load_reference_sigma(&local_48,polar);
  __return_storage_ptr__->npts = local_48.first;
  pdVar2 = (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
    if (local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.second.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.second.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  ExchCXX::XCKernel::XCKernel((XCKernel *)&local_48,backend,kern,polar);
  std::vector<double,_std::allocator<double>_>::resize
            (&__return_storage_ptr__->exc,(long)__return_storage_ptr__->npts);
  iVar1 = __return_storage_ptr__->npts;
  bVar5 = (**(code **)(*(long *)CONCAT44(local_48._4_4_,local_48.first) + 0x38))();
  std::vector<double,_std::allocator<double>_>::resize
            (&__return_storage_ptr__->vrho,(long)iVar1 << (bVar5 & 0x3f));
  iVar1 = __return_storage_ptr__->npts;
  plVar4 = (long *)CONCAT44(local_48._4_4_,local_48.first);
  cVar6 = (**(code **)(*plVar4 + 0x18))(plVar4);
  if (cVar6 == '\0') {
    cVar6 = (**(code **)(*plVar4 + 0x38))(plVar4);
    __new_size = (long)iVar1 * 3;
    if (cVar6 == '\0') {
      __new_size = (long)iVar1;
    }
  }
  else {
    __new_size = 0;
  }
  std::vector<double,_std::allocator<double>_>::resize(&__return_storage_ptr__->vsigma,__new_size);
  (**(code **)(*(long *)CONCAT44(local_48._4_4_,local_48.first) + 0x90))
            ((long *)CONCAT44(local_48._4_4_,local_48.first),__return_storage_ptr__->npts,
             (__return_storage_ptr__->rho).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->sigma).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->exc).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->vrho).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__return_storage_ptr__->vsigma).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start);
  ExchCXX::XCKernel::~XCKernel((XCKernel *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

gga_reference gen_gga_reference_values(ExchCXX::Backend backend, 
  ExchCXX::Kernel kern, ExchCXX::Spin polar) {
  
  using namespace ExchCXX;
  gga_reference ref_vals;
  std::tie( ref_vals.npts, ref_vals.rho )   = load_reference_density( polar );
  std::tie( ref_vals.npts, ref_vals.sigma ) = load_reference_sigma( polar );

  XCKernel func( backend, kern, polar );

  ref_vals.exc.resize( func.exc_buffer_len( ref_vals.npts ) );
  ref_vals.vrho.resize( func.vrho_buffer_len( ref_vals.npts ) );
  ref_vals.vsigma.resize( func.vsigma_buffer_len( ref_vals.npts ) );

  func.eval_exc_vxc( ref_vals.npts, ref_vals.rho.data(), ref_vals.sigma.data(), 
    ref_vals.exc.data(), ref_vals.vrho.data(), ref_vals.vsigma.data() );

  return ref_vals;

}